

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm.c
# Opt level: O1

void asm_snap_prep(ASMState *as)

{
  ushort uVar1;
  IRIns *pIVar2;
  uint uVar3;
  uint uVar4;
  GCtrace *pGVar5;
  uint uVar6;
  
  if (as->snapalloc == 0) {
    uVar4 = as->snaprename;
    pGVar5 = as->T;
    if (uVar4 < pGVar5->nins) {
      do {
        pIVar2 = pGVar5->ir;
        uVar1 = pIVar2[uVar4].field_0.op1;
        if (((as->snapfilt1 >> ((ulong)uVar1 & 0x3f) & 1) != 0) &&
           (uVar3 = (uVar1 + 0xfb3ee249) * 0x4000,
           uVar6 = (uVar1 + 0xfb3ee249 ^ (uint)uVar1) - (uVar3 | 0x3ecf),
           (as->snapfilt2 >> ((ulong)(((uVar3 >> 0x1b | 0x7d9e0) ^ uVar6) - (uVar6 >> 0x13)) & 0x3f)
           & 1) != 0)) {
          ra_spill(as,as->ir + uVar1);
          *(undefined2 *)((long)pIVar2 + (ulong)uVar4 * 8 + 2) = 0x7fff;
        }
        uVar4 = as->snaprename + 1;
        as->snaprename = uVar4;
        pGVar5 = as->T;
      } while (uVar4 < pGVar5->nins);
    }
  }
  else {
    as->snapalloc = 0;
    asm_snap_alloc(as,as->snapno);
    as->snaprename = as->T->nins;
  }
  return;
}

Assistant:

static void asm_snap_prep(ASMState *as)
{
  if (as->snapalloc) {
    /* Alloc on first invocation for each snapshot. */
    as->snapalloc = 0;
    asm_snap_alloc(as, as->snapno);
    as->snaprename = as->T->nins;
  } else {
    /* Check any renames above the highwater mark. */
    for (; as->snaprename < as->T->nins; as->snaprename++) {
      IRIns *ir = &as->T->ir[as->snaprename];
      if (asm_snap_checkrename(as, ir->op1))
	ir->op2 = REF_BIAS-1;  /* Kill rename. */
    }
  }
}